

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFileListGeneratorGlob::cmFileListGeneratorGlob
          (cmFileListGeneratorGlob *this,cmFileListGeneratorGlob *r)

{
  pointer pcVar1;
  
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorGlob_005af210;
  (this->Pattern)._M_dataplus._M_p = (pointer)&(this->Pattern).field_2;
  pcVar1 = (r->Pattern)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Pattern,pcVar1,pcVar1 + (r->Pattern)._M_string_length);
  return;
}

Assistant:

cmFileListGeneratorGlob(cmFileListGeneratorGlob const& r):
    cmFileListGeneratorBase(), Pattern(r.Pattern) {}